

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

void __thiscall
CVmObjFrameRef::load_image_data(CVmObjFrameRef *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  vm_prop_id_t vVar1;
  int iVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  long lVar5;
  vm_frameref_ext *pvVar6;
  void *in_RDX;
  undefined4 in_ESI;
  vm_val_t *in_RDI;
  vm_val_t *v;
  int i;
  vm_frameref_ext *ext;
  int nparams;
  int nlocals;
  char *in_stack_ffffffffffffffc0;
  vm_val_t *buf;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  CVmObjFrameRef *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar2 = ::osrp2(in_RDX);
  iVar3 = ::osrp2((void *)((long)in_RDX + 2));
  lVar5 = (long)in_RDX + 4;
  pvVar6 = alloc_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  pvVar6->fp = (vm_val_t *)0x0;
  vmb_get_dh(in_stack_ffffffffffffffc0,in_RDI);
  CVmObjTable::request_post_load_init
            ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (vm_obj_id_t)((ulong)(lVar5 + 5) >> 0x20));
  vmb_get_dh(in_stack_ffffffffffffffc0,in_RDI);
  vVar4 = vmb_get_objid((char *)0x2ffbcc);
  pvVar6->defobj = vVar4;
  vVar4 = vmb_get_objid((char *)0x2ffbee);
  pvVar6->targobj = vVar4;
  vVar1 = vmb_get_propid((char *)0x2ffc10);
  pvVar6->targprop = vVar1;
  vmb_get_dh(in_stack_ffffffffffffffc0,in_RDI);
  buf = pvVar6->vars;
  for (iVar2 = iVar2 + iVar3; 0 < iVar2; iVar2 = iVar2 + -1) {
    vmb_get_dh((char *)buf,in_RDI);
    buf = buf + 1;
  }
  return;
}

Assistant:

void CVmObjFrameRef::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* read the number of variables */
    int nlocals = osrp2(ptr);
    int nparams = osrp2(ptr+2);
    ptr += 4;

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive.  
     */
    ext->fp = 0;

    /* load the entry pointer */
    vmb_get_dh(ptr, &ext->entry);
    ptr += VMB_DATAHOLDER;

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* load the method context variables */
    vmb_get_dh(ptr, &ext->self);
    ptr += VMB_DATAHOLDER;

    ext->defobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targprop = vmb_get_propid(ptr);
    ptr += VMB_PROP_ID;

    vmb_get_dh(ptr, &ext->invokee);
    ptr += VMB_DATAHOLDER;

    /* read the variable snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_get_dh(ptr, v);
        ptr += VMB_DATAHOLDER;
    }
}